

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O1

void __thiscall
TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test::testBody
          (TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test *this)

{
  TestRegistry *this_00;
  long lVar1;
  UtestShell *pUVar2;
  SimpleString *pSVar3;
  char *pcVar4;
  SimpleStringCollection stringCollection;
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [3];
  SimpleString local_a0;
  SimpleStringCollection local_90;
  CommandLineTestRunner local_70;
  undefined8 local_50;
  long lStack_48;
  undefined8 local_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  
  local_28 = "-b";
  local_38 = "tests.exe";
  pcStack_30 = "-v";
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry;
  TestRegistry::addTest(this_00,(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).test2);
  CommandLineTestRunner::CommandLineTestRunner(&local_70,3,&local_38,this_00);
  local_70._vptr_CommandLineTestRunner = (_func_int **)&PTR__CommandLineTestRunner_003483c0;
  local_50 = 0;
  lStack_48 = 0;
  local_40 = 0;
  CommandLineTestRunner::runAllTestsMain(&local_70);
  SimpleStringCollection::SimpleStringCollection(&local_90);
  lVar1 = lStack_48;
  SimpleString::SimpleString(&local_a0,"\n");
  SimpleString::split((SimpleString *)(lVar1 + 0x20),&local_a0,&local_90);
  SimpleString::~SimpleString(&local_a0);
  pUVar2 = UtestShell::getCurrent();
  pSVar3 = SimpleStringCollection::operator[](&local_90,0);
  pcVar4 = SimpleString::asCharString(pSVar3);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"test1",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xf7);
  pUVar2 = UtestShell::getCurrent();
  pSVar3 = SimpleStringCollection::operator[](&local_90,1);
  pcVar4 = SimpleString::asCharString(pSVar3);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"test2",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xf8);
  SimpleStringCollection::~SimpleStringCollection(&local_90);
  CommandLineTestRunner::~CommandLineTestRunner(&local_70);
  return;
}

Assistant:

TEST(CommandLineTestRunner, testsCanBeRunInReverseOrder)
{
    const char* argv[] = { "tests.exe", "-v", "-b"};

    registry.addTest(test2);
    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(3, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    SimpleStringCollection stringCollection;
    commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().split("\n", stringCollection);
    STRCMP_CONTAINS("test1", stringCollection[0].asCharString());
    STRCMP_CONTAINS("test2", stringCollection[1].asCharString());
}